

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_band.c
# Opt level: O2

int main(int argc,char **argv)

{
  N_Vector x;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  SUNMatrix A;
  N_Vector p_Var9;
  long lVar10;
  SUNLinearSolver S;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  undefined8 uVar15;
  long lVar16;
  undefined8 uVar17;
  SUNContext sunctx;
  undefined8 local_78;
  undefined8 local_70;
  N_Vector local_68;
  long local_60;
  N_Vector local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  iVar1 = SUNContext_Create(0,&sunctx);
  if (iVar1 == 0) {
    if (argc < 5) {
      pcVar13 = 
      "ERROR: FOUR (4) Inputs required: matrix cols, matrix uband, matrix lband, print timing ";
    }
    else {
      lVar8 = atol(argv[1]);
      if (lVar8 < 1) {
        pcVar13 = "ERROR: number of matrix columns must be a positive integer ";
      }
      else {
        local_60 = atol(argv[2]);
        if (local_60 < 1 || lVar8 <= local_60) {
          pcVar13 = 
          "ERROR: matrix upper bandwidth must be a positive integer, less than number of columns ";
        }
        else {
          local_50 = atol(argv[3]);
          if (0 < local_50 && local_50 < lVar8) {
            iVar1 = atoi(argv[4]);
            SetTiming(iVar1);
            lVar14 = local_60;
            printf("\nBand linear solver test: size %ld, bandwidths %ld %ld\n\n",lVar8,local_60,
                   local_50);
            A = (SUNMatrix)SUNBandMatrix(lVar8,lVar14,local_50,sunctx);
            local_78 = SUNBandMatrix(lVar8,lVar14,local_50,sunctx);
            p_Var9 = (N_Vector)N_VNew_Serial(lVar8,sunctx);
            local_70 = N_VNew_Serial(lVar8,sunctx);
            local_68 = (N_Vector)N_VNew_Serial(lVar8,sunctx);
            local_58 = p_Var9;
            local_38 = N_VGetArrayPointer(p_Var9);
            local_40 = lVar8 + -1;
            local_48 = local_40 - local_50;
            for (lVar14 = 0; lVar14 != lVar8; lVar14 = lVar14 + 1) {
              lVar10 = SUNBandMatrix_Column(A,lVar14);
              lVar11 = local_60;
              if (lVar14 < local_60) {
                lVar11 = lVar14;
              }
              lVar11 = -lVar11;
              lVar16 = local_40 - lVar14;
              if (lVar14 <= local_48) {
                lVar16 = local_50;
              }
              while( true ) {
                iVar1 = rand();
                if (lVar16 < lVar11) break;
                *(double *)(lVar10 + lVar11 * 8) = (double)iVar1 / 2147483647.0;
                lVar11 = lVar11 + 1;
              }
              *(double *)(local_38 + lVar14 * 8) = (double)iVar1 / 2147483647.0;
            }
            iVar1 = SUNMatScaleAddI(1.0 / (double)(local_60 + local_50 + 1),A);
            uVar17 = local_78;
            if (iVar1 == 0) {
              SUNMatCopy(A,local_78);
              x = local_58;
              uVar15 = local_70;
              N_VScale(0x3ff0000000000000,local_58,local_70);
              p_Var9 = local_68;
              iVar1 = SUNMatMatvec(A,x,local_68);
              if (iVar1 == 0) {
                S = (SUNLinearSolver)SUNLinSol_Band(x,A,sunctx);
                if (S != (SUNLinearSolver)0x0) {
                  iVar1 = Test_SUNLinSolInitialize(S,0);
                  iVar2 = Test_SUNLinSolSetup(S,A,0);
                  iVar3 = Test_SUNLinSolSolve(S,A,x,p_Var9,2.220446049250313e-14,1,0);
                  iVar4 = Test_SUNLinSolGetType(S,SUNLINEARSOLVER_DIRECT,0);
                  iVar5 = Test_SUNLinSolGetID(S,SUNLINEARSOLVER_BAND,0);
                  iVar6 = Test_SUNLinSolLastFlag(S,0);
                  iVar7 = Test_SUNLinSolSpace(S,0);
                  uVar12 = iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
                  if (uVar12 == 0) {
                    puts("SUCCESS: SUNLinSol module passed all tests \n ");
                    uVar15 = local_70;
                    uVar17 = local_78;
                  }
                  else {
                    printf("FAIL: SUNLinSol module failed %i tests \n \n",(ulong)uVar12);
                    puts("\nA (original) =");
                    uVar17 = local_78;
                    SUNBandMatrix_Print(local_78,_stdout);
                    puts("\nA (factored) =");
                    SUNBandMatrix_Print(A,_stdout);
                    puts("\nx (original) =");
                    uVar15 = local_70;
                    N_VPrint_Serial(local_70);
                    puts("\nx (computed) =");
                    N_VPrint_Serial(x);
                  }
                  SUNLinSolFree(S);
                  SUNMatDestroy(A);
                  SUNMatDestroy(uVar17);
                  N_VDestroy(x);
                  N_VDestroy(uVar15);
                  N_VDestroy(local_68);
                  SUNContext_Free(&sunctx);
                  return uVar12;
                }
                pcVar13 = "FAIL: SUNLinSol_Band returned NULL";
              }
              else {
                pcVar13 = "FAIL: SUNLinSol SUNMatMatvec failure";
              }
              puts(pcVar13);
              SUNMatDestroy(A);
              SUNMatDestroy(uVar17);
              N_VDestroy(x);
              N_VDestroy(uVar15);
            }
            else {
              puts("FAIL: SUNLinSol SUNMatScaleAddI failure");
              SUNMatDestroy(A);
              SUNMatDestroy(local_78);
              N_VDestroy(local_58);
              N_VDestroy(local_70);
              p_Var9 = local_68;
            }
            N_VDestroy(p_Var9);
            return 1;
          }
          pcVar13 = 
          "ERROR: matrix lower bandwidth must be a positive integer, less than number of columns ";
        }
      }
    }
  }
  else {
    pcVar13 = "ERROR: SUNContext_Create failed";
  }
  puts(pcVar13);
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;                   /* counter for test failures  */
  sunindextype cols, uband, lband; /* matrix columns, bandwidths */
  SUNLinearSolver LS;              /* solver object              */
  SUNMatrix A, B;                  /* test matrices              */
  N_Vector x, y, b;                /* test vectors               */
  int print_timing;
  sunindextype j, k, kstart, kend;
  sunrealtype *colj, *xdata;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check input and set matrix dimensions */
  if (argc < 5)
  {
    printf("ERROR: FOUR (4) Inputs required: matrix cols, matrix uband, matrix "
           "lband, print timing \n");
    return (-1);
  }

  cols = (sunindextype)atol(argv[1]);
  if (cols <= 0)
  {
    printf("ERROR: number of matrix columns must be a positive integer \n");
    return (-1);
  }

  uband = (sunindextype)atol(argv[2]);
  if ((uband <= 0) || (uband >= cols))
  {
    printf("ERROR: matrix upper bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  lband = (sunindextype)atol(argv[3]);
  if ((lband <= 0) || (lband >= cols))
  {
    printf("ERROR: matrix lower bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  print_timing = atoi(argv[4]);
  SetTiming(print_timing);

  printf("\nBand linear solver test: size %ld, bandwidths %ld %ld\n\n",
         (long int)cols, (long int)uband, (long int)lband);

  /* Create matrices and vectors */
  A = SUNBandMatrix(cols, uband, lband, sunctx);
  B = SUNBandMatrix(cols, uband, lband, sunctx);
  x = N_VNew_Serial(cols, sunctx);
  y = N_VNew_Serial(cols, sunctx);
  b = N_VNew_Serial(cols, sunctx);

  /* Fill matrix and x vector with uniform random data in [0,1] */
  xdata = N_VGetArrayPointer(x);
  for (j = 0; j < cols; j++)
  {
    /* A matrix column */
    colj   = SUNBandMatrix_Column(A, j);
    kstart = (j < uband) ? -j : -uband;
    kend   = (j > cols - 1 - lband) ? cols - 1 - j : lband;
    for (k = kstart; k <= kend; k++)
    {
      colj[k] = (sunrealtype)rand() / (sunrealtype)RAND_MAX;
    }

    /* x entry */
    xdata[j] = (sunrealtype)rand() / (sunrealtype)RAND_MAX;
  }

  /* Scale/shift matrix to ensure diagonal dominance */
  fails += SUNMatScaleAddI(ONE / (uband + lband + 1), A);
  if (fails)
  {
    printf("FAIL: SUNLinSol SUNMatScaleAddI failure\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return (1);
  }

  /* copy A and x into B and y to print in case of solver failure */
  SUNMatCopy(A, B);
  N_VScale(ONE, x, y);

  /* create right-hand side vector for linear solve */
  fails = SUNMatMatvec(A, x, b);
  if (fails)
  {
    printf("FAIL: SUNLinSol SUNMatMatvec failure\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return (1);
  }

  /* Create banded linear solver */
  LS = SUNLinSol_Band(x, A, sunctx);
  if (LS == NULL)
  {
    printf("FAIL: SUNLinSol_Band returned NULL\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return (1);
  }

  /* Run Tests */
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSetup(LS, A, 0);
  fails += Test_SUNLinSolSolve(LS, A, x, b, 100 * SUN_UNIT_ROUNDOFF, SUNTRUE, 0);

  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_DIRECT, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_BAND, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol module failed %i tests \n \n", fails);
    printf("\nA (original) =\n");
    SUNBandMatrix_Print(B, stdout);
    printf("\nA (factored) =\n");
    SUNBandMatrix_Print(A, stdout);
    printf("\nx (original) =\n");
    N_VPrint_Serial(y);
    printf("\nx (computed) =\n");
    N_VPrint_Serial(x);
  }
  else { printf("SUCCESS: SUNLinSol module passed all tests \n \n"); }

  /* Free solver, matrix and vectors */
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNMatDestroy(B);
  N_VDestroy(x);
  N_VDestroy(y);
  N_VDestroy(b);
  SUNContext_Free(&sunctx);

  return (fails);
}